

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractMajor.hpp
# Opt level: O0

void __thiscall AbstractMajor::getRequirements(AbstractMajor *this)

{
  byte bVar1;
  bool bVar2;
  invalid_argument *this_00;
  istream *piVar3;
  undefined1 local_2d0 [8];
  string temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  istream local_218 [8];
  ifstream fin;
  AbstractMajor *this_local;
  
  std::operator+(&local_258,"major/",&this->name);
  std::operator+(&local_238,&local_258,".txt");
  std::ifstream::ifstream(local_218,(string *)&local_238,_S_in);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    temp.field_2._M_local_buf[0xf] = '\x01';
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_2a8,"Error, requirements file for ",&this->name);
    std::operator+(&local_288,&local_2a8," not found.");
    std::invalid_argument::invalid_argument(this_00,(string *)&local_288);
    temp.field_2._M_local_buf[0xf] = '\0';
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)local_2d0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_218,(string *)local_2d0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->requiredCourses,(value_type *)local_2d0);
  }
  std::__cxx11::string::~string((string *)local_2d0);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void getRequirements() {
            ifstream fin("major/" + this->name + ".txt");
            
            if (!fin.is_open()) {
                throw std::invalid_argument("Error, requirements file for " + this->name + " not found.");
            }
            string temp;

            while(getline(fin, temp)) {
                requiredCourses.push_back(temp);
            }
        }